

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O0

void duckdb::RLEScanConstant<duckdb::hugeint_t>
               (RLEScanState<duckdb::hugeint_t> *scan_state,rle_count_t *index_pointer,
               hugeint_t *data_pointer,idx_t scan_count,Vector *result)

{
  bool bVar1;
  hugeint_t *phVar2;
  long in_RCX;
  uint64_t *puVar3;
  long in_RDX;
  rle_count_t *in_RSI;
  RLEScanState<duckdb::hugeint_t> *in_RDI;
  Vector *unaff_retaddr;
  hugeint_t *result_data;
  
  Vector::SetVectorType(unaff_retaddr,(VectorType)((ulong)in_RDI >> 0x38));
  phVar2 = ConstantVector::GetData<duckdb::hugeint_t>((Vector *)0xa222f6);
  puVar3 = (uint64_t *)(in_RDX + in_RDI->entry_pos * 0x10);
  phVar2->lower = *puVar3;
  phVar2->upper = puVar3[1];
  in_RDI->position_in_entry = in_RCX + in_RDI->position_in_entry;
  bVar1 = RLEScanState<duckdb::hugeint_t>::ExhaustedRun(in_RDI,in_RSI);
  if (bVar1) {
    RLEScanState<duckdb::hugeint_t>::ForwardToNextRun(in_RDI);
  }
  return;
}

Assistant:

static void RLEScanConstant(RLEScanState<T> &scan_state, rle_count_t *index_pointer, T *data_pointer, idx_t scan_count,
                            Vector &result) {
	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	auto result_data = ConstantVector::GetData<T>(result);
	result_data[0] = data_pointer[scan_state.entry_pos];
	scan_state.position_in_entry += scan_count;
	if (scan_state.ExhaustedRun(index_pointer)) {
		scan_state.ForwardToNextRun();
	}
	return;
}